

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O2

string_type * __thiscall
nonsugar::
usage<nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)72,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)110,std::__cxx11::string>>>>,nonsugar::detail::subcommand<std::__cxx11::string,char,(char)65,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)108,int>,nonsugar::detail::argument<std::__cxx11::string,char,(char)114,int>>>>>,std::tuple<>>>
          (string_type *__return_storage_ptr__,nonsugar *this,
          basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__H_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__n_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__l_,_int>,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__r_,_int>_>_>_>_>,_std::tuple<>_>
          *command)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *f;
  pointer pbVar2;
  ulong uVar3;
  pointer pbVar4;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *row;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  table;
  size_type c0_max;
  size_type c1_max;
  sstream<string_type> ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  nonsugar *local_1f0;
  ulong local_1e8;
  string_type *local_1e0;
  ulong local_1d8;
  undefined1 *local_1d0;
  ulong *local_1c8;
  ulong *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  local_1f0 = this;
  local_1e0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar1 = std::operator<<(local_1a8,"Usage: ");
  std::operator<<(poVar1,(string *)local_1f0);
  std::operator<<(local_1a8," [OPTION...]");
  std::operator<<(local_1a8," COMMAND [ARG...]");
  std::operator<<(local_1a8,"\n");
  detail::lines<std::__cxx11::string>(&local_208,(detail *)(local_1f0 + 0x20),s);
  for (pbVar2 = local_208.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != local_208.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    poVar1 = std::operator<<(local_1a8,"  ");
    poVar1 = std::operator<<(poVar1,(string *)pbVar2);
    std::operator<<(poVar1,"\n");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208);
  std::operator<<(local_1a8,"\nOptions:\n");
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8 = &local_1e8;
  local_1e8 = 0;
  local_1c0 = &local_1d8;
  local_1d8 = 0;
  local_1d0 = (undefined1 *)&local_208;
  usage<nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)72,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)110,std::__cxx11::string>>>>,nonsugar::detail::subcommand<std::__cxx11::string,char,(char)65,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)108,int>,nonsugar::detail::argument<std::__cxx11::string,char,(char)114,int>>>>>,std::tuple<>>>(nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)72,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)110,std::__cxx11::string>>>>,nonsugar::detail::subcommand<std::__cxx11::string,char,(char)65,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)108,int>,nonsugar::detail::argument<std::__cxx11::string,char,(char)114,int>>>>>,std::tuple<>>const&)
  ::{lambda(auto:1_const&)#2}::operator()
            ((_lambda_auto_1_const___2_ *)&local_1d0,
             (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>
              *)(local_1f0 + 0x40));
  pbVar2 = local_208.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = local_208.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar2; pbVar4 = pbVar4 + 3) {
    poVar1 = std::operator<<(local_1a8,"  ");
    std::operator<<(poVar1,(string *)(pbVar4 + 2));
    for (uVar3 = pbVar4[2]._M_string_length; uVar3 < local_1e8; uVar3 = uVar3 + 1) {
      std::operator<<(local_1a8," ");
    }
    poVar1 = std::operator<<(local_1a8,"  ");
    std::operator<<(poVar1,(string *)(pbVar4 + 1));
    for (uVar3 = pbVar4[1]._M_string_length; uVar3 < local_1d8; uVar3 = uVar3 + 1) {
      std::operator<<(local_1a8," ");
    }
    poVar1 = std::operator<<(local_1a8,"  ");
    poVar1 = std::operator<<(poVar1,(string *)pbVar4);
    std::operator<<(poVar1,"\n");
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_208);
  std::operator<<(local_1a8,"\nCommands:\n");
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8 = 0;
  local_1c8 = &local_1e8;
  local_1d0 = (undefined1 *)&local_208;
  detail::
  tuple_for_each_impl<std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)72,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)110,std::__cxx11::string>>>>,nonsugar::detail::subcommand<std::__cxx11::string,char,(char)65,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)108,int>,nonsugar::detail::argument<std::__cxx11::string,char,(char)114,int>>>>>const&,nonsugar::usage<nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)72,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)110,std::__cxx11::string>>>>,nonsugar::detail::subcommand<std::__cxx11::string,char,(char)65,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)108,int>,nonsugar::detail::argument<std::__cxx11::string,char,(char)114,int>>>>>,std::tuple<>>>(nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)72,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)110,std::__cxx11::string>>>>,nonsugar::detail::subcommand<std::__cxx11::string,char,(char)65,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)108,int>,nonsugar::detail::argument<std::__cxx11::string,char,(char)114,int>>>>>,std::tuple<>>const&)::_lambda(auto:1_const&)_3_,0ul,1ul>
            ((string *)(local_1f0 + 0xe8));
  pbVar2 = local_208.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = local_208.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar2; pbVar4 = pbVar4 + 2) {
    poVar1 = std::operator<<(local_1a8,"  ");
    std::operator<<(poVar1,(string *)(pbVar4 + 1));
    for (uVar3 = pbVar4[1]._M_string_length; uVar3 < local_1e8; uVar3 = uVar3 + 1) {
      std::operator<<(local_1a8," ");
    }
    poVar1 = std::operator<<(local_1a8,"  ");
    poVar1 = std::operator<<(poVar1,(string *)pbVar4);
    std::operator<<(poVar1,"\n");
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_208);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return local_1e0;
}

Assistant:

inline typename Command::string_type usage(Command const &command)
{
    using string_type = typename Command::string_type;
    detail::sstream<string_type> ss;
    auto const &_ = detail::widen<string_type>;

    // Usage
    ss << "Usage: " << command.m_header;
    if (std::tuple_size<typename Command::flag_tuple_type>::value > 0) {
        ss << " [OPTION...]";
    }
    if (std::tuple_size<typename Command::subcommand_tuple_type>::value > 0) {
        ss << " COMMAND [ARG...]";
    }
    detail::tuple_for_each(command.m_arguments, [&](auto const &arg)
        {
            using value_type = typename detail::remove_cvr_t<decltype(arg)>::value_type;
            if (detail::is_optional<value_type>::value) {
                ss << " [" << arg.placeholder << "]";
            } else if (detail::is_container_and_not_string<string_type, value_type>::value) {
                ss << " [" << arg.placeholder << "...]";
            } else {
                ss << " " << arg.placeholder;
            }
        });
    ss << "\n";
    for (auto const &f : detail::lines(command.m_footer)) {
        ss << "  " << f << "\n";
    }

    // Flags
    if (std::tuple_size<typename Command::flag_tuple_type>::value > 0) {
        ss << "\nOptions:\n";
        std::vector<std::tuple<string_type, string_type, string_type>> table;
        typename string_type::size_type c0_max = 0, c1_max = 0;
        detail::tuple_for_each(command.m_flags, [&](auto const &flg)
            {
                using value_type = typename detail::remove_cvr_t<decltype(flg)>::value_type;
                auto const short_ = detail::join_map(flg.short_names, _(", "), [&](auto const c)
                    {
                        if (std::is_void<value_type>::value) {
                            return _("-") + c;
                        } else if (detail::is_optional<value_type>::value) {
                            return _("-") + c + _("[") + flg.placeholder + _("]");
                        } else {
                            return _("-") + c + _(" ") + flg.placeholder;
                        }
                    });
                auto const long_ = detail::join_map(flg.long_names, _(", "), [&](auto const &s)
                    {
                        if (std::is_void<value_type>::value) {
                            return _("--") + s;
                        } else if (detail::is_optional<value_type>::value) {
                            return _("--") + s + _("[=") + flg.placeholder + _("]");
                        } else {
                            return _("--") + s + _("=") + flg.placeholder;
                        }
                    });
                auto help = detail::lines(flg.help);
                if (help.empty()) help.push_back(string_type());
                bool first = true;
                for (auto const &h : help) {
                    if (std::exchange(first, false)) table.emplace_back(short_, long_, h);
                    else table.emplace_back(string_type(), string_type(), h);
                }
                c0_max = (std::max)(c0_max, short_.size());
                c1_max = (std::max)(c1_max, long_.size());
            });
        for (auto const &row : table) {
            ss << "  " << std::get<0>(row);
            for (auto i = std::get<0>(row).size(); i < c0_max; ++i) ss << " ";
            ss << "  " << std::get<1>(row);
            for (auto i = std::get<1>(row).size(); i < c1_max; ++i) ss << " ";
            ss << "  " << std::get<2>(row) << "\n";
        }
    }

    // Subcommands
    if (std::tuple_size<typename Command::subcommand_tuple_type>::value > 0) {
        ss << "\nCommands:\n";
        std::vector<std::tuple<string_type, string_type>> table;
        typename string_type::size_type c0_max = 0;
        detail::tuple_for_each(command.m_subcommands, [&](auto const &subcmd)
            {
                auto help = detail::lines(subcmd.help);
                if (help.empty()) help.push_back(string_type());
                bool first = true;
                for (auto const &h : help) {
                    if (std::exchange(first, false)) table.emplace_back(subcmd.name, h);
                    else table.emplace_back(string_type(), h);
                }
                c0_max = (std::max)(c0_max, subcmd.name.size());
            });
        for (auto const &row : table) {
            ss << "  " << std::get<0>(row);
            for (auto i = std::get<0>(row).size(); i < c0_max; ++i) ss << " ";
            ss << "  " << std::get<1>(row) << "\n";
        }
    }

    return ss.str();
}